

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::loops_leave(Forth *this)

{
  uint uVar1;
  CAddr CVar2;
  uint cell;
  Forth *this_local;
  
  data(this,8);
  data(this,8);
  data(this,5);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->controlStackLoops);
  CVar2 = getDataPointer(this);
  data(this,(uVar1 - CVar2) + 8);
  data(this,9);
  return;
}

Assistant:

void loops_leave(){
			data(rFrom_Xt);
			data(rFrom_Xt);
			data(branchXt);
			auto cell = controlStackLoops.getTop(); 
			data(cell - getDataPointer()+8);
			data(DropDropXt);
		}